

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

void __thiscall
brotli::Command::Command
          (Command *this,size_t insertlen,size_t copylen,size_t copylen_code,size_t distance_code)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint16_t inscode;
  uint16_t copycode;
  uint16_t uVar5;
  
  this->insert_len_ = (uint32_t)insertlen;
  this->copy_len_ = (uint32_t)copylen;
  PrefixEncodeCopyDistance(distance_code,0,0,&this->dist_prefix_,&this->dist_extra_);
  uVar5 = this->dist_prefix_;
  inscode = GetInsertLengthCode(insertlen);
  copycode = GetCopyLengthCode(copylen_code);
  iVar1 = *(int *)(kInsExtra + (uint)inscode * 4);
  iVar2 = *(int *)(kCopyExtra + (uint)copycode * 4);
  uVar3 = *(uint *)(kInsBase + (uint)inscode * 4);
  uVar4 = *(uint *)(kCopyBase + (uint)copycode * 4);
  uVar5 = CombineLengthCodes(inscode,copycode,uVar5 == 0);
  this->cmd_prefix_ = uVar5;
  this->cmd_extra_ =
       copylen_code - uVar4 << ((byte)iVar1 & 0x3f) | insertlen - uVar3 |
       (ulong)(uint)(iVar2 + iVar1) << 0x30;
  return;
}

Assistant:

Command(size_t insertlen, size_t copylen, size_t copylen_code,
          size_t distance_code)
      : insert_len_(static_cast<uint32_t>(insertlen))
      , copy_len_(static_cast<uint32_t>(copylen)) {
    // The distance prefix and extra bits are stored in this Command as if
    // npostfix and ndirect were 0, they are only recomputed later after the
    // clustering if needed.
    PrefixEncodeCopyDistance(distance_code, 0, 0, &dist_prefix_, &dist_extra_);
    GetLengthCode(insertlen, copylen_code, dist_prefix_ == 0,
                  &cmd_prefix_, &cmd_extra_);
  }